

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

uint mtar_checksum(mtar_raw_header_t *rh)

{
  uint local_24;
  uint res;
  uchar *p;
  uint i;
  mtar_raw_header_t *rh_local;
  
  local_24 = 0x100;
  for (p._4_4_ = 0; p._4_4_ < 0x94; p._4_4_ = p._4_4_ + 1) {
    local_24 = (byte)rh->name[p._4_4_] + local_24;
  }
  for (p._4_4_ = 0x9c; p._4_4_ < 0x200; p._4_4_ = p._4_4_ + 1) {
    local_24 = (byte)rh->name[p._4_4_] + local_24;
  }
  return local_24;
}

Assistant:

static unsigned mtar_checksum(const mtar_raw_header_t* rh) {
  unsigned i;
  const unsigned char *p = (const unsigned char*) rh;
  unsigned res = 256;
  for (i = 0; i < offsetof(mtar_raw_header_t, checksum); i++) {
    res += p[i];
  }
  for (i = offsetof(mtar_raw_header_t, type); i < sizeof(*rh); i++) {
    res += p[i];
  }
  return res;
}